

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

bool ImGui::IsMousePosValid(ImVec2 *mouse_pos)

{
  ImVec2 *pIVar1;
  
  if (GImGui != (ImGuiContext *)0x0) {
    pIVar1 = &(GImGui->IO).MousePos;
    if (mouse_pos != (ImVec2 *)0x0) {
      pIVar1 = mouse_pos;
    }
    return (bool)(-(-256000.0 <= pIVar1->y) & -(-256000.0 <= pIVar1->x) & 1);
  }
  __assert_fail("GImGui != __null",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui.cpp"
                ,0x109f,"bool ImGui::IsMousePosValid(const ImVec2 *)");
}

Assistant:

bool ImGui::IsMousePosValid(const ImVec2* mouse_pos)
{
    // The assert is only to silence a false-positive in XCode Static Analysis.
    // Because GImGui is not dereferenced in every code path, the static analyzer assume that it may be NULL (which it doesn't for other functions).
    IM_ASSERT(GImGui != NULL);
    const float MOUSE_INVALID = -256000.0f;
    ImVec2 p = mouse_pos ? *mouse_pos : GImGui->IO.MousePos;
    return p.x >= MOUSE_INVALID && p.y >= MOUSE_INVALID;
}